

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O1

bool __thiscall Character::AddTradeItem(Character *this,short item,int amount)

{
  list<Character_Item,_std::allocator<Character_Item>_> *plVar1;
  size_t *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  short sVar4;
  World *pWVar5;
  EIF *pEVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  mapped_type *pmVar12;
  ulong uVar13;
  _List_node_base *p_Var14;
  key_type local_78;
  key_type local_58;
  ulong local_38;
  
  pWVar5 = this->world;
  paVar3 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"TradeAddQuantity","");
  pmVar12 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar5->config,&local_78);
  bVar7 = util::variant::GetBool(pmVar12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar3) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (0 < item) {
    local_38 = (ulong)(ushort)item;
    pWVar5 = this->world;
    pEVar6 = pWVar5->eif;
    uVar13 = ((long)(pEVar6->data).
                    super__Vector_base<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pEVar6->data).
                    super__Vector_base<EIF_Data_Base<EIF>,_std::allocator<EIF_Data_Base<EIF>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
    if (local_38 <= uVar13 && uVar13 - local_38 != 0) {
      uVar9 = HasItem(this,item,!bVar7);
      if ((int)uVar9 < amount) {
        amount = uVar9;
      }
      if (amount < 1) {
        bVar8 = true;
      }
      else {
        local_78._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"MaxTrade","");
        pmVar12 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&pWVar5->config,&local_78);
        iVar10 = util::variant::GetInt(pmVar12);
        bVar8 = iVar10 < amount;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar3) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      if (!bVar8) {
        if (bVar7) {
          iVar10 = 0;
          for (p_Var14 = (this->trade_inventory).
                         super__List_base<Character_Item,_std::allocator<Character_Item>_>._M_impl.
                         _M_node.super__List_node_base._M_next;
              p_Var14 != (_List_node_base *)&this->trade_inventory; p_Var14 = p_Var14->_M_next) {
            if (*(short *)&p_Var14[1]._M_next == item) {
              iVar10 = *(int *)((long)&p_Var14[1]._M_next + 4);
            }
          }
          iVar10 = iVar10 + amount;
          if (iVar10 < 0) {
            bVar8 = true;
          }
          else {
            pWVar5 = this->world;
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"MaxTrade","");
            pmVar12 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&pWVar5->config,&local_58);
            iVar11 = util::variant::GetInt(pmVar12);
            bVar8 = iVar11 < iVar10;
          }
          if ((-1 < iVar10) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2)) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          if (bVar8) {
            return false;
          }
        }
        plVar1 = &this->trade_inventory;
        bVar8 = false;
        p_Var14 = (_List_node_base *)plVar1;
        do {
          p_Var14 = (((_List_base<Character_Item,_std::allocator<Character_Item>_> *)
                     &p_Var14->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          if (p_Var14 == (_List_node_base *)plVar1) break;
          sVar4 = *(short *)&p_Var14[1]._M_next;
          if (sVar4 == item) {
            uVar9 = amount;
            if (bVar7) {
              uVar9 = *(int *)((long)&p_Var14[1]._M_next + 4) + amount;
            }
            *(uint *)((long)&p_Var14[1]._M_next + 4) = uVar9;
            bVar8 = true;
          }
        } while (sVar4 != item);
        if (p_Var14 == (_List_node_base *)plVar1) {
          p_Var14 = (_List_node_base *)operator_new(0x18);
          p_Var14[1]._M_next = (_List_node_base *)(((ulong)(uint)amount << 0x20) + local_38);
          std::__detail::_List_node_base::_M_hook(p_Var14);
          psVar2 = &(this->trade_inventory).
                    super__List_base<Character_Item,_std::allocator<Character_Item>_>._M_impl.
                    _M_node._M_size;
          *psVar2 = *psVar2 + 1;
          CheckQuestRules(this);
          return true;
        }
        return bVar8;
      }
    }
  }
  return false;
}

Assistant:

bool Character::AddTradeItem(short item, int amount)
{
	bool trade_add_quantity = bool(this->world->config["TradeAddQuantity"]);

	if (item <= 0 || static_cast<std::size_t>(item) >= this->world->eif->data.size())
	{
		return false;
	}

	int hasitem = this->HasItem(item, !trade_add_quantity);

	amount = std::min(amount, hasitem);

	if (amount <= 0 || amount > int(this->world->config["MaxTrade"]))
	{
		return false;
	}

	// Prevent overflow
	if (trade_add_quantity)
	{
		int tradeitem = 0;

		UTIL_FOREACH(this->trade_inventory, trade_item)
		{
			if (trade_item.id == item)
			{
				tradeitem = trade_item.amount;
			}
		}

		if (tradeitem + amount < 0 || tradeitem + amount > int(this->world->config["MaxTrade"]))
		{
			return false;
		}

	}

	UTIL_FOREACH_REF(this->trade_inventory, character_item)
	{
		if (character_item.id == item)
		{
			if (trade_add_quantity)
				character_item.amount += amount;
			else
				character_item.amount = amount;

			return true;
		}
	}

	Character_Item newitem;
	newitem.id = item;
	newitem.amount = amount;

	this->trade_inventory.push_back(newitem);
	this->CheckQuestRules();

	return true;
}